

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dep_for_basicchild_boostfunc.cpp
# Opt level: O2

void g(int *ptr)

{
  long lVar1;
  ostream *poVar2;
  function<void_(int_&)> binded_h;
  undefined1 local_30 [32];
  
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"g begin: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  local_30._8_8_ = h;
  local_30._16_4_ = 10;
  local_30._0_8_ =
       boost::function1<void,int&>::
       assign_to<boost::_bi::bind_t<void,void(*)(int&,int),boost::_bi::list2<boost::arg<1>,boost::_bi::value<int>>>>(boost::_bi::bind_t<void,void(*)(int&,int),boost::_bi::list2<boost::arg<int>,boost::_bi::value<int>>>)
       ::stored_vtable + 1;
  depspawn::spawn<boost::function<void(int&)>,int&>((function<void_(int_&)> *)local_30,ptr);
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"g finish: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  boost::function1<void,_int_&>::~function1((function1<void,_int_&> *)local_30);
  return;
}

Assistant:

void g(int *ptr) {
  LOG("g begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  
  boost::function<void(int&)> binded_h = boost::bind(h, _1, 10);
  
  //binded_h(*ptr); //Test to see that the function works
  
  spawn(binded_h, (*ptr));
  
  LOG("g finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
}